

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setWindowModality(QMessageBox *this,WindowModality windowModality)

{
  QWidget *parent;
  QFlagsStorage<Qt::WindowType> f;
  
  QWidget::setWindowModality((QWidget *)this,windowModality);
  parent = *(QWidget **)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x10);
  if (windowModality == WindowModal && parent != (QWidget *)0x0) {
    f.i = 5;
  }
  else {
    f.i = 3;
  }
  QWidget::setParent((QWidget *)this,parent,(WindowFlags)f.i);
  setDefaultButton(this,*(QPushButton **)
                         (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 800));
  return;
}

Assistant:

void QMessageBox::setWindowModality(Qt::WindowModality windowModality)
{
    QDialog::setWindowModality(windowModality);

    if (parentWidget() && windowModality == Qt::WindowModal)
        setParent(parentWidget(), Qt::Sheet);
    else
        setParent(parentWidget(), Qt::Dialog);
    setDefaultButton(d_func()->defaultButton);
}